

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O1

void __thiscall
CMU462::DynamicScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  float fVar1;
  double dVar2;
  double local_78;
  double dStack_70;
  double local_68;
  Vector4D local_58;
  Vector4D local_38;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00272318;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar1 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar1;
  local_58.x = (light_info->direction).x;
  local_58.y = (light_info->direction).y;
  local_58.z = (light_info->direction).z;
  local_58.w = 1.0;
  Matrix4x4::operator*(transform,&local_58);
  Vector4D::to3D(&local_38);
  (this->direction).x = -local_78;
  (this->direction).y = -dStack_70;
  (this->direction).z = -local_68;
  dVar2 = local_68 * local_68 + local_78 * local_78 + dStack_70 * dStack_70;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  (this->direction).x = dVar2 * (this->direction).x;
  (this->direction).y = dVar2 * (this->direction).y;
  (this->direction).z = dVar2 * (this->direction).z;
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info,
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
    this->direction.normalize();
  }